

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsockets.c
# Opt level: O0

int libcmsockets_LTX_self_check
              (CManager cm,CMtrans_services_conflict svc,transport_entry_conflict trans,
              attr_list attrs)

{
  int iVar1;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  int i;
  int port_match;
  char my_host_name [256];
  char *host_name;
  int int_port_num;
  int host_addr;
  socket_client_data_ptr sd;
  int *in_stack_00000160;
  int *in_stack_00000168;
  int *in_stack_00000170;
  int in_stack_0000017c;
  char *in_stack_00000180;
  attr_list in_stack_00000190;
  CMTransport_trace in_stack_00000198;
  void *in_stack_000001a0;
  int local_150;
  int local_14c;
  char local_148 [264];
  char *local_40;
  int local_38;
  int local_34;
  long local_30;
  undefined8 local_28;
  long local_18;
  undefined8 local_10;
  int local_4;
  
  local_30 = *(long *)(in_RDX + 0x98);
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  get_IP_config(in_stack_00000180,in_stack_0000017c,in_stack_00000170,in_stack_00000168,
                in_stack_00000160,(int *)cm,in_stack_00000190,in_stack_00000198,in_stack_000001a0);
  if (libcmsockets_LTX_self_check::IP == 0) {
    libcmsockets_LTX_self_check::IP = 0x7f000001;
  }
  iVar1 = query_attr(local_28,CM_IP_HOSTNAME,0,&local_40);
  if (iVar1 == 0) {
    (**(code **)(local_18 + 0x30))
              (local_10,"CMself check TCP/IP transport found no IP_HOST attribute");
    local_40 = (char *)0x0;
  }
  iVar1 = query_attr(local_28,CM_IP_ADDR,0,&local_34);
  if (iVar1 == 0) {
    (**(code **)(local_18 + 0x30))
              (local_10,"CMself check TCP/IP transport found no IP_ADDR attribute");
    if (local_40 == (char *)0x0) {
      return 0;
    }
    local_34 = 0;
  }
  iVar1 = query_attr(local_28,CM_IP_PORT,0,&local_38);
  if (iVar1 == 0) {
    (**(code **)(local_18 + 0x30))
              (local_10,"CMself check TCP/IP transport found no IP_PORT attribute");
    local_4 = 0;
  }
  else if ((local_40 == (char *)0x0) || (iVar1 = strcmp(local_40,local_148), iVar1 == 0)) {
    if ((local_34 == 0) || (libcmsockets_LTX_self_check::IP == local_34)) {
      local_14c = 0;
      for (local_150 = 0; local_150 < *(int *)(local_30 + 0x10); local_150 = local_150 + 1) {
        if (local_38 == *(int *)(*(long *)(local_30 + 0x20) + (long)local_150 * 4)) {
          local_14c = *(int *)(*(long *)(local_30 + 0x20) + (long)local_150 * 4);
        }
      }
      if (local_14c == 0) {
        (**(code **)(local_18 + 0x30))
                  (local_10,"CMself check - Ports don\'t match, %d, %d",local_38,0);
        local_4 = 0;
      }
      else {
        (**(code **)(local_18 + 0x30))(local_10,"CMself check returning TRUE");
        local_4 = 1;
      }
    }
    else {
      (**(code **)(local_18 + 0x30))
                (local_10,"CMself check - Host IP addrs don\'t match, %lx, %lx",
                 libcmsockets_LTX_self_check::IP,local_34);
      local_4 = 0;
    }
  }
  else {
    (**(code **)(local_18 + 0x30))(local_10,"CMself check - Hostnames don\'t match");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

extern int
libcmsockets_LTX_self_check(CManager cm, CMtrans_services svc, transport_entry trans, attr_list attrs)
{

    socket_client_data_ptr sd = trans->trans_data;
    int host_addr;
    int int_port_num;
    char *host_name;
    char my_host_name[256];
    static int IP = 0;

    get_IP_config(my_host_name, sizeof(host_name), &IP, NULL, NULL, NULL,
		  NULL, svc->trace_out, (void *)cm);

    if (IP == 0) {
	if (IP == 0) IP = INADDR_LOOPBACK;
    }
    if (!query_attr(attrs, CM_IP_HOSTNAME, /* type pointer */ NULL,
    /* value pointer */ (attr_value *)(intptr_t) & host_name)) {
	svc->trace_out(cm, "CMself check TCP/IP transport found no IP_HOST attribute");
	host_name = NULL;
    }
    if (!query_attr(attrs, CM_IP_ADDR, /* type pointer */ NULL,
    /* value pointer */ (attr_value *)(intptr_t) & host_addr)) {
	svc->trace_out(cm, "CMself check TCP/IP transport found no IP_ADDR attribute");
	if (host_name == NULL) return 0;
	host_addr = 0;
    }
    if (!query_attr(attrs, CM_IP_PORT, /* type pointer */ NULL,
    /* value pointer */ (attr_value *)(intptr_t) & int_port_num)) {
	svc->trace_out(cm, "CMself check TCP/IP transport found no IP_PORT attribute");
	return 0;
    }
    if (host_name && (strcmp(host_name, my_host_name) != 0)) {
	svc->trace_out(cm, "CMself check - Hostnames don't match");
	return 0;
    }
    if (host_addr && (IP != host_addr)) {
	svc->trace_out(cm, "CMself check - Host IP addrs don't match, %lx, %lx", IP, host_addr);
	return 0;
    }
    int port_match = 0;
    for (int i = 0; i < sd->listen_count; i++) {
	if (int_port_num == sd->listen_ports[i]) {
	    port_match = sd->listen_ports[i];
	}
    }
    if (!port_match) {
	svc->trace_out(cm, "CMself check - Ports don't match, %d, %d", int_port_num, port_match);
	return 0;
    }
    svc->trace_out(cm, "CMself check returning TRUE");
    return 1;
}